

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O3

map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
* build_dom_tree(map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *__return_storage_ptr__,
                map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *dom)

{
  _Rb_tree_header *p_Var1;
  undefined1 *__k;
  int iVar2;
  void *pvVar3;
  int *piVar4;
  _Base_ptr p_Var5;
  mapped_type *this;
  ostream *poVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  ulong uVar9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  _Self __tmp;
  vector<int,_std::allocator<int>_> v_1;
  vector<int,_std::allocator<int>_> v;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> local_68;
  void *local_48;
  undefined8 uStack_40;
  int *local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var5 = (dom->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var11 = &(dom->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var11) {
    do {
      p_Var7 = p_Var5 + 1;
      __k = &p_Var5[1].field_0x4;
      p_Var8 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var8 == (_Base_ptr)0x0) {
LAB_0019476c:
        local_48 = (void *)0x0;
        uStack_40 = 0;
        local_38 = (int *)0x0;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_48,(iterator)0x0,(int *)p_Var7);
        local_68.first = *(int *)__k;
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_68.second,(vector<int,_std::allocator<int>_> *)&local_48);
        std::
        _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
        ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
                  ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                    *)__return_storage_ptr__,&local_68);
        pvVar3 = local_48;
        piVar4 = local_38;
        if (local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (int *)0x0) {
          operator_delete(local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_68.second.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.second.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          pvVar3 = local_48;
          piVar4 = local_38;
        }
      }
      else {
        iVar2 = *(int *)__k;
        p_Var10 = &p_Var1->_M_header;
        do {
          if (iVar2 <= (int)*(size_t *)(p_Var8 + 1)) {
            p_Var10 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[(int)*(size_t *)(p_Var8 + 1) < iVar2];
        } while (p_Var8 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var10 == p_Var1) ||
           (iVar2 < (int)((_Rb_tree_header *)p_Var10)->_M_node_count)) goto LAB_0019476c;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_68,
                   (vector<int,_std::allocator<int>_> *)((long)p_Var10 + 0x28));
        if (local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_68,
                     (iterator)
                     local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,(int *)p_Var7);
        }
        else {
          *local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = p_Var7->_M_color;
          local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        this = std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)__k);
        std::vector<int,_std::allocator<int>_>::operator=
                  (this,(vector<int,_std::allocator<int>_> *)&local_68);
        pvVar3 = (void *)CONCAT44(local_68._4_4_,local_68.first);
        piVar4 = local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)piVar4 - (long)pvVar3);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var11);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  poVar6 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"*** desplay dominator tree ***",0x1e);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  for (p_Var7 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var1;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 7;
    poVar6 = (ostream *)std::ostream::operator<<(&std::cout,p_Var7[1]._M_color);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," child(s):",10);
    if (p_Var7[1]._M_left != p_Var7[1]._M_parent) {
      uVar9 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 7;
        std::ostream::operator<<(&std::cout,(&(p_Var7[1]._M_parent)->_M_color)[uVar9]);
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)((long)p_Var7[1]._M_left - (long)p_Var7[1]._M_parent >> 2));
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  return __return_storage_ptr__;
}

Assistant:

map<int, vector<int>> build_dom_tree(map<int, int> dom) {
  map<int, vector<int>> dom_tree;
  map<int, int>::iterator tr;
  for (tr = dom.begin(); tr != dom.end(); tr++) {
    map<int, vector<int>>::iterator dtr = dom_tree.find(tr->second);
    if (dtr == dom_tree.end()) {
      vector<int> v;
      v.push_back(tr->first);
      dom_tree.insert(map<int, vector<int>>::value_type(tr->second, v));
    } else {
      vector<int> v = dtr->second;
      v.push_back(tr->first);
      dom_tree[tr->second] = v;
    }
  }
  cout << endl << "*** desplay dominator tree ***" << endl;
  map<int, vector<int>>::iterator it;
  for (it = dom_tree.begin(); it != dom_tree.end(); it++) {
    cout << setw(7) << it->first << " child(s):";
    for (int i = 0; i < it->second.size(); i++) {
      cout << " " << setw(7) << it->second[i];
    }
    cout << endl;
  }
  return dom_tree;
}